

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O2

void __thiscall
vkt::tessellation::anon_unknown_0::InvariantOuterEdge::BaseTestInstance::BaseTestInstance
          (BaseTestInstance *this,Context *context,CaseDefinition caseDef,int numPatchesToDraw)

{
  Unique<vk::Handle<(vk::HandleType)19>_> *pUVar1;
  Unique<vk::Handle<(vk::HandleType)21>_> *pUVar2;
  VkBuffer VVar3;
  VkDeviceSize VVar4;
  VkDeviceSize VVar5;
  Context *this_00;
  Handle<(vk::HandleType)19> HVar6;
  VkAllocationCallbacks *pVVar7;
  deUint32 dVar8;
  int iVar9;
  TextureFormat format;
  float *pfVar10;
  DeviceInterface *pDVar11;
  VkDevice pVVar12;
  Allocator *pAVar13;
  DescriptorSetLayoutBuilder *this_01;
  DescriptorPoolBuilder *this_02;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DescriptorSetUpdateBuilder *this_03;
  undefined8 uVar14;
  VkDescriptorBufferInfo resultBufferInfo;
  DescriptorSetLayoutBuilder local_e8;
  Unique<vk::Handle<(vk::HandleType)22>_> *local_98;
  Unique<vk::Handle<(vk::HandleType)17>_> *local_90;
  Unique<vk::Handle<(vk::HandleType)23>_> *local_88;
  Unique<vk::Handle<(vk::HandleType)21>_> *local_80;
  Buffer *local_78;
  Buffer *local_70;
  vector<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
  *local_68;
  Context *local_60;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_58;
  
  uVar14 = caseDef._8_8_;
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__BaseTestInstance_00c08c78;
  (this->m_caseDef).primitiveType = (int)caseDef._0_8_;
  (this->m_caseDef).spacingMode = (int)((ulong)caseDef._0_8_ >> 0x20);
  (this->m_caseDef).winding = (int)uVar14;
  (this->m_caseDef).usePointMode = (bool)(char)((ulong)uVar14 >> 0x20);
  *(int3 *)&(this->m_caseDef).field_0xd = (int3)((ulong)uVar14 >> 0x28);
  this->m_numPatchesToDraw = numPatchesToDraw;
  this->m_vertexFormat = VK_FORMAT_R32_SFLOAT;
  local_60 = context;
  format = ::vk::mapVkFormat(VK_FORMAT_R32_SFLOAT);
  dVar8 = tcu::getPixelSize(format);
  this->m_vertexStride = dVar8;
  outerEdgeDescriptions(&this->m_edgeDescriptions,(this->m_caseDef).primitiveType);
  iVar9 = this->m_numPatchesToDraw;
  local_68 = &this->m_edgeDescriptions;
  pfVar10 = std::__max_element<float_const*,__gnu_cxx::__ops::_Iter_less_iter>
                      (&tessellation::(anonymous_namespace)::InvariantOuterEdge::BaseTestInstance::
                        m_singleOuterEdgeLevels,
                       _ZZNK3vkt12tessellation12_GLOBAL__N_120OuterEdgeDescription11descriptionB5cxx11EvE15coordinateNames_rel
                      );
  generatePatchTessLevels((vector<float,_std::allocator<float>_> *)&local_e8,iVar9,0,*pfVar10);
  iVar9 = multiplePatchReferencePrimitiveCount
                    (caseDef.primitiveType,caseDef.spacingMode,(bool)(caseDef.usePointMode & 1),
                     (float *)local_e8.m_bindings.
                              super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                              ._M_impl.super__Vector_impl_data._M_start,iVar9);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&local_e8);
  this->m_maxNumPrimitivesInDrawCall = iVar9;
  this->m_vertexDataSizeBytes = (ulong)(this->m_numPatchesToDraw * this->m_vertexStride * 6);
  pDVar11 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar12 = Context::getDevice((this->super_TestInstance).m_context);
  pAVar13 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  makeBufferCreateInfo((VkBufferCreateInfo *)&local_e8,this->m_vertexDataSizeBytes,0x80);
  tessellation::Buffer::Buffer
            (&this->m_vertexBuffer,pDVar11,pVVar12,pAVar13,(VkBufferCreateInfo *)&local_e8,
             (MemoryRequirement)0x1);
  this->m_resultBufferPrimitiveDataOffset = 0x10;
  this->m_resultBufferSizeBytes = (long)this->m_maxNumPrimitivesInDrawCall << 6 | 0x10;
  local_70 = &this->m_vertexBuffer;
  pDVar11 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar12 = Context::getDevice((this->super_TestInstance).m_context);
  pAVar13 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  makeBufferCreateInfo((VkBufferCreateInfo *)&local_e8,this->m_resultBufferSizeBytes,0x20);
  local_78 = &this->m_resultBuffer;
  tessellation::Buffer::Buffer
            (local_78,pDVar11,pVVar12,pAVar13,(VkBufferCreateInfo *)&local_e8,(MemoryRequirement)0x1
            );
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_e8);
  this_01 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      (&local_e8,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,8);
  this_00 = local_60;
  pDVar11 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar12 = Context::getDevice((this->super_TestInstance).m_context);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&local_58,this_01,pDVar11,pVVar12,0);
  pVVar7 = local_58.m_data.deleter.m_allocator;
  pVVar12 = local_58.m_data.deleter.m_device;
  pDVar11 = local_58.m_data.deleter.m_deviceIface;
  HVar6.m_internal = local_58.m_data.object.m_internal;
  pUVar1 = &this->m_descriptorSetLayout;
  resultBufferInfo.range = (VkDeviceSize)local_58.m_data.deleter.m_device;
  resultBufferInfo.buffer.m_internal = local_58.m_data.object.m_internal;
  resultBufferInfo.offset = (VkDeviceSize)local_58.m_data.deleter.m_deviceIface;
  local_58.m_data.object.m_internal._0_4_ = 0;
  local_58.m_data.object.m_internal._4_4_ = 0;
  local_58.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_58.m_data.deleter.m_device = (VkDevice)0x0;
  local_58.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_device = pVVar12;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_allocator = pVVar7;
  (pUVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
       HVar6.m_internal;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_deviceIface = pDVar11;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_58);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&local_e8);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&local_58);
  this_02 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&local_58,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  pDVar11 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar12 = Context::getDevice((this->super_TestInstance).m_context);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&resultBufferInfo,this_02,pDVar11,pVVar12,1,1)
  ;
  VVar5 = resultBufferInfo.range;
  VVar4 = resultBufferInfo.offset;
  VVar3 = resultBufferInfo.buffer;
  pUVar2 = &this->m_descriptorPool;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)resultBufferInfo.range;
  local_e8.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pVVar7;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)resultBufferInfo.buffer.m_internal;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)resultBufferInfo.offset;
  resultBufferInfo.buffer.m_internal = 0;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = 0;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)VVar5;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator
       = pVVar7;
  (pUVar2->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal =
       VVar3.m_internal;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)VVar4;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&resultBufferInfo);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&local_58);
  local_80 = pUVar2;
  pDVar11 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar12 = Context::getDevice((this->super_TestInstance).m_context);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&resultBufferInfo,pDVar11,pVVar12,
                    (VkDescriptorPool)
                    (pUVar2->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.
                    m_internal,
                    (VkDescriptorSetLayout)
                    (pUVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.
                    m_internal);
  VVar5 = resultBufferInfo.range;
  VVar4 = resultBufferInfo.offset;
  VVar3 = resultBufferInfo.buffer;
  local_98 = &this->m_descriptorSet;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)resultBufferInfo.range;
  local_e8.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)resultBufferInfo.buffer.m_internal;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)resultBufferInfo.offset;
  resultBufferInfo.buffer.m_internal = 0;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = 0;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
       (VkDevice)VVar5;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
  m_internal = 0;
  (local_98->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
       VVar3.m_internal;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)VVar4;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&resultBufferInfo);
  pDVar11 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar12 = Context::getDevice((this->super_TestInstance).m_context);
  makeRenderPassWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&resultBufferInfo,pDVar11,pVVar12);
  VVar5 = resultBufferInfo.range;
  VVar4 = resultBufferInfo.offset;
  VVar3 = resultBufferInfo.buffer;
  local_90 = &this->m_renderPass;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)resultBufferInfo.range;
  local_e8.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)resultBufferInfo.buffer.m_internal;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)resultBufferInfo.offset;
  resultBufferInfo.buffer.m_internal = 0;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = 0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       (VkDevice)VVar5;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (local_90->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal =
       VVar3.m_internal;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)VVar4;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&resultBufferInfo);
  pDVar11 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar12 = Context::getDevice((this->super_TestInstance).m_context);
  makeFramebufferWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&resultBufferInfo,pDVar11,pVVar12,
             (VkRenderPass)
             (local_90->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal);
  VVar5 = resultBufferInfo.range;
  VVar4 = resultBufferInfo.offset;
  VVar3 = resultBufferInfo.buffer;
  local_88 = &this->m_framebuffer;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)resultBufferInfo.range;
  local_e8.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)resultBufferInfo.buffer.m_internal;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)resultBufferInfo.offset;
  resultBufferInfo.buffer.m_internal = 0;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = 0;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       (VkDevice)VVar5;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (local_88->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.object.m_internal =
       VVar3.m_internal;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)VVar4;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&resultBufferInfo);
  pDVar11 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar12 = Context::getDevice((this->super_TestInstance).m_context);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&resultBufferInfo,pDVar11,pVVar12,
                     (VkDescriptorSetLayout)
                     (pUVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.
                     m_internal);
  VVar5 = resultBufferInfo.range;
  VVar4 = resultBufferInfo.offset;
  VVar3 = resultBufferInfo.buffer;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)resultBufferInfo.range;
  local_e8.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)resultBufferInfo.buffer.m_internal;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)resultBufferInfo.offset;
  resultBufferInfo.buffer.m_internal = 0;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = 0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       (VkDevice)VVar5;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)0x0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal =
       VVar3.m_internal;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)VVar4;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&resultBufferInfo);
  pDVar11 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar12 = Context::getDevice((this->super_TestInstance).m_context);
  dVar8 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&resultBufferInfo,pDVar11,pVVar12,dVar8);
  VVar5 = resultBufferInfo.range;
  VVar4 = resultBufferInfo.offset;
  VVar3 = resultBufferInfo.buffer;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)resultBufferInfo.range;
  local_e8.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)resultBufferInfo.buffer.m_internal;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)resultBufferInfo.offset;
  resultBufferInfo.buffer.m_internal = 0;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = 0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)VVar5;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       VVar3.m_internal;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)VVar4;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&resultBufferInfo);
  pDVar11 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar12 = Context::getDevice((this->super_TestInstance).m_context);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&resultBufferInfo,pDVar11,pVVar12,
             (VkCommandPool)
             (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
             m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  VVar5 = resultBufferInfo.range;
  VVar4 = resultBufferInfo.offset;
  VVar3 = resultBufferInfo.buffer;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)resultBufferInfo.range;
  local_e8.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)resultBufferInfo.buffer.m_internal;
  local_e8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)resultBufferInfo.offset;
  resultBufferInfo.buffer.m_internal = 0;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = 0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       (VkDevice)VVar5;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal = 0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)VVar3.m_internal;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)VVar4;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&resultBufferInfo);
  vki = Context::getInstanceInterface(this_00);
  physDevice = Context::getPhysicalDevice(this_00);
  requireFeatures(vki,physDevice,0xb);
  resultBufferInfo.range = this->m_resultBufferSizeBytes;
  resultBufferInfo.buffer.m_internal =
       (this->m_resultBuffer).m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
       m_internal;
  resultBufferInfo.offset = 0;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&local_e8);
  local_58.m_data.object.m_internal._0_4_ = 0;
  local_58.m_data.object.m_internal._4_4_ = 0;
  this_03 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      ((DescriptorSetUpdateBuilder *)&local_e8,
                       (VkDescriptorSet)
                       (local_98->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.
                       m_internal,(Location *)&local_58,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       &resultBufferInfo);
  pDVar11 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar12 = Context::getDevice((this->super_TestInstance).m_context);
  ::vk::DescriptorSetUpdateBuilder::update(this_03,pDVar11,pVVar12);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&local_e8);
  return;
}

Assistant:

BaseTestInstance::BaseTestInstance (Context& context, const CaseDefinition caseDef, const int numPatchesToDraw)
	: TestInstance							(context)
	, m_caseDef								(caseDef)
	, m_numPatchesToDraw					(numPatchesToDraw)
	, m_vertexFormat						(VK_FORMAT_R32_SFLOAT)
	, m_vertexStride						(tcu::getPixelSize(mapVkFormat(m_vertexFormat)))
	, m_edgeDescriptions					(outerEdgeDescriptions(m_caseDef.primitiveType))
	, m_maxNumPrimitivesInDrawCall			(computeMaxPrimitiveCount(m_numPatchesToDraw, caseDef.primitiveType, caseDef.spacingMode, caseDef.usePointMode, m_singleOuterEdgeLevels))
	, m_vertexDataSizeBytes					(NUM_TESS_LEVELS * m_numPatchesToDraw * m_vertexStride)
	, m_vertexBuffer						(m_context.getDeviceInterface(), m_context.getDevice(), m_context.getDefaultAllocator(),
											makeBufferCreateInfo(m_vertexDataSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible)
	, m_resultBufferPrimitiveDataOffset		((int)sizeof(deInt32) * 4)
	, m_resultBufferSizeBytes				(m_resultBufferPrimitiveDataOffset + m_maxNumPrimitivesInDrawCall * sizeof(PerPrimitive))
	, m_resultBuffer						(m_context.getDeviceInterface(), m_context.getDevice(), m_context.getDefaultAllocator(),
											makeBufferCreateInfo(m_resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible)
	, m_descriptorSetLayout					(DescriptorSetLayoutBuilder()
											.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_GEOMETRY_BIT)
											.build(m_context.getDeviceInterface(), m_context.getDevice()))
	, m_descriptorPool						(DescriptorPoolBuilder()
											.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
											.build(m_context.getDeviceInterface(), m_context.getDevice(), VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u))
	, m_descriptorSet						(makeDescriptorSet(m_context.getDeviceInterface(), m_context.getDevice(), *m_descriptorPool, *m_descriptorSetLayout))
	, m_renderPass							(makeRenderPassWithoutAttachments (m_context.getDeviceInterface(), m_context.getDevice()))
	, m_framebuffer							(makeFramebufferWithoutAttachments(m_context.getDeviceInterface(), m_context.getDevice(), *m_renderPass))
	, m_pipelineLayout						(makePipelineLayout               (m_context.getDeviceInterface(), m_context.getDevice(), *m_descriptorSetLayout))
	, m_cmdPool								(makeCommandPool                  (m_context.getDeviceInterface(), m_context.getDevice(), m_context.getUniversalQueueFamilyIndex()))
	, m_cmdBuffer							(allocateCommandBuffer            (m_context.getDeviceInterface(), m_context.getDevice(), *m_cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY))
{
	requireFeatures(context.getInstanceInterface(), context.getPhysicalDevice(),
					FEATURE_TESSELLATION_SHADER | FEATURE_GEOMETRY_SHADER | FEATURE_VERTEX_PIPELINE_STORES_AND_ATOMICS);

	const VkDescriptorBufferInfo resultBufferInfo = makeDescriptorBufferInfo(m_resultBuffer.get(), 0ull, m_resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(m_context.getDeviceInterface(), m_context.getDevice());
}